

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall
Assimp::ValidateDSProcess::SearchForInvalidTextures
          (ValidateDSProcess *this,aiMaterial *pMaterial,aiTextureType type)

{
  char *pcVar1;
  uint uVar2;
  aiMaterialProperty *paVar3;
  aiMesh *paVar4;
  ValidateDSProcess *pVVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined8 extraout_RAX;
  uint a;
  ulong uVar9;
  ValidateDSProcess *pVVar10;
  long lVar11;
  ulong uVar12;
  uint local_70;
  allocator_type local_69;
  uint local_68;
  aiTextureType local_64;
  char *local_60;
  char *local_58;
  ValidateDSProcess *local_50;
  vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> mappings;
  
  pVVar10 = (ValidateDSProcess *)(ulong)type;
  local_64 = type;
  local_50 = this;
  local_58 = TextureTypeToString(type);
  uVar2 = pMaterial->mNumProperties;
  uVar8 = 0xffffffff;
  local_70 = 0;
  for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
    paVar3 = pMaterial->mProperties[uVar12];
    if (paVar3 == (aiMaterialProperty *)0x0) {
      __assert_fail("nullptr != prop",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                    ,0x250,
                    "void Assimp::ValidateDSProcess::SearchForInvalidTextures(const aiMaterial *, aiTextureType)"
                   );
    }
    pcVar1 = (paVar3->mKey).data;
    pVVar10 = (ValidateDSProcess *)pcVar1;
    iVar7 = strcmp(pcVar1,"$tex.file");
    if ((iVar7 == 0) && (paVar3->mSemantic == local_64)) {
      uVar6 = paVar3->mIndex;
      if ((int)paVar3->mIndex < (int)uVar8) {
        uVar6 = uVar8;
      }
      uVar8 = uVar6;
      if (paVar3->mType != aiPTI_String) {
        ReportError(pVVar10,"Material property %s is expected to be a string",pcVar1);
      }
      local_70 = local_70 + 1;
    }
  }
  if (uVar8 + 1 != local_70) {
    ReportError(pVVar10,"%s #%i is set, but there are only %i %s textures",local_58,(ulong)uVar8,
                (ulong)local_70,local_58);
  }
  if (local_70 != 0) {
    pVVar10 = (ValidateDSProcess *)&mappings;
    std::vector<aiTextureMapping,_std::allocator<aiTextureMapping>_>::vector
              ((vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> *)pVVar10,
               (long)(int)local_70,&local_69);
    local_68 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    local_60 = "Material property %s%i is expected to be an integer (size is %i)";
    for (uVar12 = 0; uVar12 < pMaterial->mNumProperties; uVar12 = uVar12 + 1) {
      paVar3 = pMaterial->mProperties[uVar12];
      if (paVar3->mSemantic == local_64) {
        uVar2 = paVar3->mIndex;
        if ((int)local_70 <= (int)uVar2) {
          ReportError(pVVar10,
                      "Found texture property with index %i, although there are only %i textures of type %s"
                      ,(ulong)uVar2,(ulong)local_70,local_58);
        }
        pcVar1 = (paVar3->mKey).data;
        pVVar10 = (ValidateDSProcess *)pcVar1;
        iVar7 = strcmp(pcVar1,"$tex.mapping");
        if (iVar7 == 0) {
          if (paVar3->mType != aiPTI_Integer) {
LAB_0031e974:
            uVar9 = (ulong)paVar3->mDataLength;
LAB_0031e989:
            ReportError(pVVar10,local_60,pcVar1,(ulong)uVar2,uVar9);
          }
          uVar9 = (ulong)paVar3->mDataLength;
          if (paVar3->mDataLength < 4) goto LAB_0031e989;
          mappings.super__Vector_base<aiTextureMapping,_std::allocator<aiTextureMapping>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2] = *(aiTextureMapping *)paVar3->mData;
        }
        else {
          pVVar10 = (ValidateDSProcess *)pcVar1;
          iVar7 = strcmp(pcVar1,"$tex.uvtrafo");
          if (iVar7 == 0) {
            if (paVar3->mType != aiPTI_Float) {
              local_60 = "Material property %s%i is expected to be 5 floats large (size is %i)";
              goto LAB_0031e974;
            }
            uVar9 = (ulong)paVar3->mDataLength;
            if (paVar3->mDataLength < 0x14) {
              local_60 = "Material property %s%i is expected to be 5 floats large (size is %i)";
              goto LAB_0031e989;
            }
          }
          else {
            pVVar10 = (ValidateDSProcess *)pcVar1;
            iVar7 = strcmp(pcVar1,"$tex.uvwsrc");
            pVVar5 = local_50;
            if (iVar7 == 0) {
              if (paVar3->mType != aiPTI_Integer) goto LAB_0031e974;
              uVar9 = (ulong)paVar3->mDataLength;
              if (paVar3->mDataLength < 4) goto LAB_0031e989;
              uVar8 = *(uint *)paVar3->mData;
              for (uVar9 = 0; uVar9 < pVVar5->mScene->mNumMeshes; uVar9 = uVar9 + 1) {
                paVar4 = pVVar5->mScene->mMeshes[uVar9];
                if (uVar12 == paVar4->mMaterialIndex) {
                  for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
                    if ((paVar4->mTextureCoords[lVar11] == (aiVector3D *)0x0) ||
                       (paVar4->mNumVertices == 0)) goto LAB_0031e833;
                  }
                  lVar11 = 8;
LAB_0031e833:
                  if ((int)lVar11 <= (int)uVar8) {
                    ReportWarning(pVVar10,
                                  "Invalid UV index: %i (key %s). Mesh %i has only %i UV channels",
                                  (ulong)uVar8,pcVar1,uVar9 & 0xffffffff);
                  }
                }
              }
              local_68 = 0;
            }
          }
        }
      }
    }
    if ((local_68 & 1) != 0) {
      for (uVar12 = 0; uVar12 < local_50->mScene->mNumMeshes; uVar12 = uVar12 + 1) {
        paVar4 = local_50->mScene->mMeshes[uVar12];
        if (((paVar4->mMaterialIndex == uVar8) &&
            (*mappings.super__Vector_base<aiTextureMapping,_std::allocator<aiTextureMapping>_>.
              _M_impl.super__Vector_impl_data._M_start == aiTextureMapping_UV)) &&
           (paVar4->mTextureCoords[0] == (aiVector3D *)0x0)) {
          ReportWarning(pVVar10,"UV-mapped texture, but there are no UV coords");
        }
      }
    }
    std::_Vector_base<aiTextureMapping,_std::allocator<aiTextureMapping>_>::~_Vector_base
              (&mappings.super__Vector_base<aiTextureMapping,_std::allocator<aiTextureMapping>_>);
  }
  return;
}

Assistant:

void ValidateDSProcess::SearchForInvalidTextures(const aiMaterial* pMaterial,
    aiTextureType type)
{
    const char* szType = TextureTypeToString(type);

    // ****************************************************************************
    // Search all keys of the material ...
    // textures must be specified with ascending indices
    // (e.g. diffuse #2 may not be specified if diffuse #1 is not there ...)
    // ****************************************************************************

    int iNumIndices = 0;
    int iIndex = -1;
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i) {
        aiMaterialProperty* prop = pMaterial->mProperties[ i ];
        ai_assert(nullptr != prop);
        if ( !::strcmp(prop->mKey.data,"$tex.file") && prop->mSemantic == static_cast<unsigned int>(type))  {
            iIndex = std::max(iIndex, (int) prop->mIndex);
            ++iNumIndices;

            if (aiPTI_String != prop->mType) {
                ReportError("Material property %s is expected to be a string", prop->mKey.data);
            }
        }
    }
    if (iIndex +1 != iNumIndices)   {
        ReportError("%s #%i is set, but there are only %i %s textures",
            szType,iIndex,iNumIndices,szType);
    }
	if (!iNumIndices) {
		return;
	}
    std::vector<aiTextureMapping> mappings(iNumIndices);

    // Now check whether all UV indices are valid ...
    bool bNoSpecified = true;
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i) {
        aiMaterialProperty* prop = pMaterial->mProperties[i];
		if (prop->mSemantic != type) {
			continue;
		}

        if ((int)prop->mIndex >= iNumIndices)
        {
            ReportError("Found texture property with index %i, although there "
                "are only %i textures of type %s",
                prop->mIndex, iNumIndices, szType);
        }

        if (!::strcmp(prop->mKey.data,"$tex.mapping"))  {
            if (aiPTI_Integer != prop->mType || prop->mDataLength < sizeof(aiTextureMapping))
            {
                ReportError("Material property %s%i is expected to be an integer (size is %i)",
                    prop->mKey.data,prop->mIndex,prop->mDataLength);
            }
            mappings[prop->mIndex] = *((aiTextureMapping*)prop->mData);
        }
        else if (!::strcmp(prop->mKey.data,"$tex.uvtrafo")) {
            if (aiPTI_Float != prop->mType || prop->mDataLength < sizeof(aiUVTransform))
            {
                ReportError("Material property %s%i is expected to be 5 floats large (size is %i)",
                    prop->mKey.data,prop->mIndex, prop->mDataLength);
            }
			//mappings[prop->mIndex] = ((aiUVTransform*)prop->mData);
        }
        else if (!::strcmp(prop->mKey.data,"$tex.uvwsrc")) {
            if (aiPTI_Integer != prop->mType || sizeof(int) > prop->mDataLength)
            {
                ReportError("Material property %s%i is expected to be an integer (size is %i)",
                    prop->mKey.data,prop->mIndex,prop->mDataLength);
            }
            bNoSpecified = false;

            // Ignore UV indices for texture channels that are not there ...

            // Get the value
            iIndex = *((unsigned int*)prop->mData);

            // Check whether there is a mesh using this material
            // which has not enough UV channels ...
            for (unsigned int a = 0; a < mScene->mNumMeshes;++a)
            {
                aiMesh* mesh = this->mScene->mMeshes[a];
                if(mesh->mMaterialIndex == (unsigned int)i)
                {
                    int iChannels = 0;
                    while (mesh->HasTextureCoords(iChannels))++iChannels;
                    if (iIndex >= iChannels)
                    {
                        ReportWarning("Invalid UV index: %i (key %s). Mesh %i has only %i UV channels",
                            iIndex,prop->mKey.data,a,iChannels);
                    }
                }
            }
        }
    }
    if (bNoSpecified)
    {
        // Assume that all textures are using the first UV channel
        for (unsigned int a = 0; a < mScene->mNumMeshes;++a)
        {
            aiMesh* mesh = mScene->mMeshes[a];
            if(mesh->mMaterialIndex == (unsigned int)iIndex && mappings[0] == aiTextureMapping_UV)
            {
                if (!mesh->mTextureCoords[0])
                {
                    // This is a special case ... it could be that the
                    // original mesh format intended the use of a special
                    // mapping here.
                    ReportWarning("UV-mapped texture, but there are no UV coords");
                }
            }
        }
    }
}